

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

void __thiscall Util::PermuteSudoku(Util *this,char *puzzle,bool pencilmark)

{
  int iVar1;
  int iVar2;
  iterator __new_size;
  reference pvVar3;
  reference pvVar4;
  byte in_DL;
  char *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  char digit_1;
  bool eliminated;
  int digit;
  int col;
  int row;
  vector<char,_std::allocator<char>_> out_puzzle;
  size_t puzzle_size;
  size_t row_size;
  array<int,_9UL> col_permutation;
  array<int,_9UL> row_permutation;
  array<int,_9UL> digit_permutation;
  size_type in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  char in_stack_ffffffffffffff36;
  char in_stack_ffffffffffffff37;
  char local_b6;
  int local_b4;
  int local_b0;
  int local_ac;
  array<int,_9UL> *in_stack_ffffffffffffff58;
  Util *in_stack_ffffffffffffff60;
  undefined1 local_80 [36];
  undefined1 local_5c [12];
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  undefined1 local_38 [39];
  byte local_11;
  char *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  memcpy(local_38,&DAT_0011c170,0x24);
  __new_size = std::array<int,_9UL>::begin((array<int,_9UL> *)0x118ba5);
  std::array<int,_9UL>::end((array<int,_9UL> *)0x118bb7);
  std::
  shuffle<int*,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  memcpy(local_5c,&DAT_0011c194,0x24);
  memcpy(local_80,&DAT_0011c1b8,0x24);
  BlockShuffle(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  BlockShuffle(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  iVar2 = 9;
  if ((local_11 & 1) != 0) {
    iVar2 = 0x51;
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x118c53);
  std::vector<char,_std::allocator<char>_>::resize(in_RDI,(size_type)__new_size);
  for (local_ac = 0; local_ac < 9; local_ac = local_ac + 1) {
    for (local_b0 = 0; local_b0 < 9; local_b0 = local_b0 + 1) {
      if ((local_11 & 1) == 0) {
        local_b6 = local_10[local_ac * 9 + local_b0];
        if (local_b6 != '.') {
          pvVar3 = std::array<int,_9UL>::operator[]
                             ((array<int,_9UL> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
          local_b6 = (char)*pvVar3 + '1';
        }
        pvVar3 = std::array<int,_9UL>::operator[]
                           ((array<int,_9UL> *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
        in_stack_ffffffffffffff24 = *pvVar3 * 9;
        pvVar3 = std::array<int,_9UL>::operator[]
                           ((array<int,_9UL> *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff58,
                            (long)(in_stack_ffffffffffffff24 + *pvVar3));
        *pvVar4 = local_b6;
      }
      else {
        for (local_b4 = 0; local_b4 < 9; local_b4 = local_b4 + 1) {
          if (local_10[local_ac * 0x51 + local_b0 * 9 + local_b4] == '.') {
            in_stack_ffffffffffffff36 = '.';
          }
          else {
            pvVar3 = std::array<int,_9UL>::operator[]
                               ((array<int,_9UL> *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff18);
            in_stack_ffffffffffffff36 = (char)*pvVar3 + '1';
          }
          in_stack_ffffffffffffff37 = in_stack_ffffffffffffff36;
          pvVar3 = std::array<int,_9UL>::operator[]
                             ((array<int,_9UL> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
          iVar1 = *pvVar3;
          pvVar3 = std::array<int,_9UL>::operator[]
                             ((array<int,_9UL> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
          in_stack_ffffffffffffff30 = iVar1 * 0x51 + *pvVar3 * 9;
          pvVar3 = std::array<int,_9UL>::operator[]
                             ((array<int,_9UL> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff58,
                              (long)(in_stack_ffffffffffffff30 + *pvVar3));
          *pvVar4 = in_stack_ffffffffffffff36;
        }
      }
    }
  }
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff58,0);
  strncpy(local_10,pvVar4,(long)iVar2 * 9);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))));
  return;
}

Assistant:

void Util::PermuteSudoku(char *puzzle, bool pencilmark) {
    array<int, 9> digit_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    shuffle(digit_permutation.begin(), digit_permutation.end(), rng_);

    array<int, 9> row_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    array<int, 9> col_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    BlockShuffle(&col_permutation);
    BlockShuffle(&row_permutation);

    size_t row_size = pencilmark ? 81 : 9;
    size_t puzzle_size = row_size * 9;

    vector<char> out_puzzle;
    out_puzzle.resize(puzzle_size);

    for (int row = 0; row < 9; row++) {
        for (int col = 0; col < 9; col++) {
            if (pencilmark) {
                for (int digit = 0; digit < 9; digit++) {
                    bool eliminated = puzzle[row * 81 + col * 9 + digit] == '.';
                    out_puzzle[row_permutation[row] * 81 +
                               col_permutation[col] * 9 +
                               digit_permutation[digit]] =
                            eliminated ? '.' : (char) ('1' + digit_permutation[digit]);
                }
            } else {
                char digit = puzzle[row * 9 + col];
                if (digit != '.') {
                    digit = (char) ('1' + digit_permutation[digit - '1']);
                }
                out_puzzle[row_permutation[row] * 9 + col_permutation[col]] = digit;
            }
        }
    }
    strncpy(puzzle, &out_puzzle[0], puzzle_size);
}